

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  int local_6c;
  float *hdr_data;
  stbi__result_info ri;
  uchar *data;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    ri._4_8_ = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if ((uchar *)ri._4_8_ == (uchar *)0x0) {
      stbi__err("unknown image type");
      s_local = (stbi__context *)0x0;
    }
    else {
      local_6c = req_comp;
      if (req_comp == 0) {
        local_6c = *comp;
      }
      s_local = (stbi__context *)stbi__ldr_to_hdr((stbi_uc *)ri._4_8_,*x,*y,local_6c);
    }
  }
  else {
    s_local = (stbi__context *)
              stbi__hdr_load(s,x,y,comp,req_comp,(stbi__result_info *)((long)&hdr_data + 4));
    if (s_local != (stbi__context *)0x0) {
      stbi__float_postprocess((float *)s_local,x,y,comp,req_comp);
    }
  }
  return (float *)s_local;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}